

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Gia_QbfFree(Qbf_Man_t *p)

{
  sat_solver_delete(p->pSatVer);
  sat_solver_delete(p->pSatSyn);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vValues);
  Vec_IntFree(p->vParMap);
  free(p);
  return;
}

Assistant:

void Gia_QbfFree( Qbf_Man_t * p )
{
    sat_solver_delete( p->pSatVer );
    sat_solver_delete( p->pSatSyn );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vValues );
    Vec_IntFree( p->vParMap );
    ABC_FREE( p );
}